

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int CollectionCacheInstallRecord(unqlite_col *pCol,jx9_int64 nId,jx9_value *pValue)

{
  uint uVar1;
  jx9_vm *pjVar2;
  unqlite_col *puVar3;
  sxi32 sVar4;
  sxu32 sVar5;
  unqlite_col_record *puVar6;
  ulong uVar7;
  unqlite_col_record *puVar8;
  unqlite_col_record *puVar9;
  unqlite_col_record *puVar10;
  unqlite_col_record **ppuVar11;
  uint uVar12;
  bool bVar13;
  
  if (pCol->nRec != 0) {
    for (puVar6 = pCol->apRecord[(uint)nId & pCol->nRecSize - 1];
        puVar6 != (unqlite_col_record *)0x0; puVar6 = puVar6->pNextCol) {
      if (puVar6->nId == nId) goto LAB_0011c372;
    }
  }
  puVar6 = (unqlite_col_record *)0x0;
LAB_0011c372:
  if (puVar6 != (unqlite_col_record *)0x0) {
    sVar4 = jx9MemObjStore(pValue,&puVar6->sValue);
    return sVar4;
  }
  puVar6 = (unqlite_col_record *)SyMemBackendPoolAlloc(&pCol->pVm->sAlloc,0x70);
  if (puVar6 != (unqlite_col_record *)0x0) {
    uVar7 = 0xfffffffffffffffc;
    do {
      *(undefined4 *)((long)&puVar6->pCol + uVar7 + 4) = 0;
      uVar7 = uVar7 + 4;
    } while (uVar7 < 0x6c);
    pjVar2 = pCol->pVm->pJx9Vm;
    (puVar6->sValue).pVm = (jx9_vm *)0x0;
    (puVar6->sValue).sBlob.pAllocator = (SyMemBackend *)0x0;
    *(undefined8 *)&(puVar6->sValue).sBlob.nFlags = 0;
    *(undefined8 *)&(puVar6->sValue).nIdx = 0;
    (puVar6->sValue).x.rVal = 0.0;
    *(undefined8 *)&(puVar6->sValue).iFlags = 0;
    (puVar6->sValue).pVm = pjVar2;
    (puVar6->sValue).sBlob.pBlob = (void *)0x0;
    (puVar6->sValue).sBlob.nByte = 0;
    (puVar6->sValue).sBlob.mByte = 0;
    (puVar6->sValue).sBlob.pAllocator = &pjVar2->sAllocator;
    (puVar6->sValue).sBlob.nFlags = 0;
    (puVar6->sValue).iFlags = 0x20;
    jx9MemObjStore(pValue,&puVar6->sValue);
    puVar6->nId = nId;
    puVar6->pCol = pCol;
    uVar1 = pCol->nRecSize;
    uVar12 = (uint)nId & uVar1 - 1;
    ppuVar11 = pCol->apRecord;
    puVar6->pNextCol = ppuVar11[uVar12];
    if (ppuVar11[uVar12] != (unqlite_col_record *)0x0) {
      ppuVar11[uVar12]->pPrevCol = puVar6;
    }
    ppuVar11[uVar12] = puVar6;
    puVar8 = pCol->pList;
    if (puVar8 != (unqlite_col_record *)0x0) {
      puVar6->pNext = puVar8;
      puVar8->pPrev = puVar6;
    }
    pCol->pList = puVar6;
    uVar12 = pCol->nRec + 1;
    pCol->nRec = uVar12;
    bVar13 = uVar12 < uVar1 * 3;
    puVar6 = (unqlite_col_record *)(ulong)CONCAT31((int3)(uVar12 >> 8),99999 < uVar12 || bVar13);
    if (99999 >= uVar12 && !bVar13) {
      puVar8 = (unqlite_col_record *)SyMemBackendAlloc(&pCol->pVm->sAlloc,uVar1 << 4);
      puVar6 = puVar8;
      if (puVar8 != (unqlite_col_record *)0x0) {
        if ((uVar1 & 0xfffffff) != 0) {
          puVar9 = (unqlite_col_record *)((long)&puVar8->pCol + (ulong)(uVar1 << 4));
          do {
            *(undefined1 *)&puVar6->pCol = 0;
            puVar10 = (unqlite_col_record *)((long)&puVar6->pCol + 1);
            if (puVar9 <= puVar10) break;
            *(undefined1 *)&puVar10->pCol = 0;
            puVar10 = (unqlite_col_record *)((long)&puVar6->pCol + 2);
            if (puVar9 <= puVar10) break;
            *(undefined1 *)&puVar10->pCol = 0;
            puVar10 = (unqlite_col_record *)((long)&puVar6->pCol + 3);
            if (puVar9 <= puVar10) break;
            *(undefined1 *)&puVar10->pCol = 0;
            puVar6 = (unqlite_col_record *)((long)&puVar6->pCol + 4);
          } while (puVar6 < puVar9);
        }
        sVar5 = pCol->nRec;
        if (sVar5 != 0) {
          ppuVar11 = &pCol->pList;
          do {
            puVar3 = (unqlite_col *)*ppuVar11;
            *(undefined8 *)&(puVar3->sSchema).sBlob.nFlags = 0;
            *(undefined8 *)&(puVar3->sSchema).nIdx = 0;
            uVar12 = *(uint *)&(puVar3->sName).zString & uVar1 * 2 - 1;
            *(unqlite_col **)&(puVar3->sSchema).sBlob.nFlags = (&puVar8->pCol)[uVar12];
            if ((&puVar8->pCol)[uVar12] != (unqlite_col *)0x0) {
              *(unqlite_col **)&((&puVar8->pCol)[uVar12]->sSchema).nIdx = puVar3;
            }
            (&puVar8->pCol)[uVar12] = puVar3;
            ppuVar11 = (unqlite_col_record **)&puVar3->nSchemaOfft;
            sVar5 = sVar5 - 1;
          } while (sVar5 != 0);
        }
        uVar12 = SyMemBackendFree(&pCol->pVm->sAlloc,pCol->apRecord);
        puVar6 = (unqlite_col_record *)(ulong)uVar12;
        pCol->apRecord = (unqlite_col_record **)puVar8;
        pCol->nRecSize = uVar1 * 2;
      }
    }
  }
  return (int)puVar6;
}

Assistant:

static int CollectionCacheInstallRecord(
	unqlite_col *pCol, /* Target collection */
	jx9_int64 nId,     /* Unique record ID */
	jx9_value *pValue  /* JSON value */
	)
{
	unqlite_col_record *pRecord;
	sxu32 iBucket;
	/* Fetch the record first */
	pRecord = CollectionCacheFetchRecord(pCol,nId);
	if( pRecord ){
		/* Record already installed, overwrite its old value  */
		jx9MemObjStore(pValue,&pRecord->sValue);
		return UNQLITE_OK;
	}
	/* Allocate a new instance */
	pRecord = (unqlite_col_record *)SyMemBackendPoolAlloc(&pCol->pVm->sAlloc,sizeof(unqlite_col_record));
	if( pRecord == 0 ){
		return UNQLITE_NOMEM;
	}
	/* Zero the structure */
	SyZero(pRecord,sizeof(unqlite_col_record));
	/* Fill in the structure */
	jx9MemObjInit(pCol->pVm->pJx9Vm,&pRecord->sValue);
	jx9MemObjStore(pValue,&pRecord->sValue);
	pRecord->nId = nId;
	pRecord->pCol = pCol;
	/* Install in the corresponding bucket */
	iBucket = COL_RECORD_HASH(nId) & (pCol->nRecSize - 1);
	pRecord->pNextCol = pCol->apRecord[iBucket];
	if( pCol->apRecord[iBucket] ){
		pCol->apRecord[iBucket]->pPrevCol = pRecord;
	}
	pCol->apRecord[iBucket] = pRecord;
	/* Link */
	MACRO_LD_PUSH(pCol->pList,pRecord);
	pCol->nRec++;
	if( (pCol->nRec >= pCol->nRecSize * 3) && pCol->nRec < 100000 ){
		/* Allocate a new larger table */
		sxu32 nNewSize = pCol->nRecSize << 1;
		unqlite_col_record *pEntry;
		unqlite_col_record **apNew;
		sxu32 n;
		
		apNew = (unqlite_col_record **)SyMemBackendAlloc(&pCol->pVm->sAlloc, nNewSize * sizeof(unqlite_col_record *));
		if( apNew ){
			/* Zero the new table */
			SyZero((void *)apNew, nNewSize * sizeof(unqlite_col_record *));
			/* Rehash all entries */
			n = 0;
			pEntry = pCol->pList;
			for(;;){
				/* Loop one */
				if( n >= pCol->nRec ){
					break;
				}
				pEntry->pNextCol = pEntry->pPrevCol = 0;
				/* Install in the new bucket */
				iBucket = COL_RECORD_HASH(pEntry->nId) & (nNewSize - 1);
				pEntry->pNextCol = apNew[iBucket];
				if( apNew[iBucket]  ){
					apNew[iBucket]->pPrevCol = pEntry;
				}
				apNew[iBucket] = pEntry;
				/* Point to the next entry */
				pEntry = pEntry->pNext;
				n++;
			}
			/* Release the old table and reflect the change */
			SyMemBackendFree(&pCol->pVm->sAlloc,(void *)pCol->apRecord);
			pCol->apRecord = apNew;
			pCol->nRecSize = nNewSize;
		}
	}
	/* All done */
	return UNQLITE_OK;
}